

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O1

void __thiscall Js::DelayedFreeArrayBuffer::ResetToNoMarkObject(DelayedFreeArrayBuffer *this)

{
  Type pAVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppAVar5;
  undefined1 local_40 [8];
  Iterator iter;
  
  local_40 = (undefined1  [8])this;
  iter.list = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
               *)this;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (iter.list ==
        (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
        0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_00b2cf38;
      *puVar4 = 0;
    }
    iter.list = (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                 *)((iter.list)->super_SListNodeBase<Memory::HeapAllocator>).next;
    if ((undefined1  [8])iter.list == local_40) {
      return;
    }
    ppAVar5 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
              ::Iterator::Data((Iterator *)local_40);
    pAVar1 = *ppAVar5;
    if (pAVar1 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DelayFreeArrayBufferHelper.cpp"
                                  ,0x18,"(item != nullptr)","item != nullptr");
      if (!bVar3) {
LAB_00b2cf38:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[5])(pAVar1,0);
  } while( true );
}

Assistant:

void Js::DelayedFreeArrayBuffer::ResetToNoMarkObject()
    {
        this->listOfBuffers.Map([](Js::ArrayBufferContentForDelayedFreeBase* item) {
            Assert(item != nullptr);
            item->SetMarkBit(false);
        });
    }